

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsort.c
# Opt level: O2

int main(void)

{
  int iVar1;
  char s [19];
  
  builtin_strncpy(s,"shreicnyjqpvozxmbt",0x13);
  qsort(s,0x12,1,compare);
  iVar1 = bcmp(s,"bcehijmnopqrstvxyz",0x13);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
           ,0xaa,"strcmp( s, sorted1 ) == 0");
  }
  builtin_strncpy(s,"shreicnyjqpvozxmbt",0x13);
  qsort(s,9,2,compare);
  iVar1 = bcmp(s,"bticjqnyozpvreshxm",0x13);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
           ,0xad,"strcmp( s, sorted2 ) == 0");
  }
  builtin_strncpy(s,"shreicnyjqpvozxmbt",0x13);
  qsort(s,1,1,compare);
  iVar1 = bcmp(s,"shreicnyjqpvozxmbt",0x13);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
           ,0xb0,"strcmp( s, presort ) == 0");
  }
  qsort(s,100,0,compare);
  iVar1 = bcmp(s,"shreicnyjqpvozxmbt",0x13);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
           ,0xb7,"strcmp( s, presort ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char presort[] = { "shreicnyjqpvozxmbt" };
    char sorted1[] = { "bcehijmnopqrstvxyz" };
    char sorted2[] = { "bticjqnyozpvreshxm" };
    char s[19];
    strcpy( s, presort );
    qsort( s, 18, 1, compare );
    TESTCASE( strcmp( s, sorted1 ) == 0 );
    strcpy( s, presort );
    qsort( s, 9, 2, compare );
    TESTCASE( strcmp( s, sorted2 ) == 0 );
    strcpy( s, presort );
    qsort( s, 1, 1, compare );
    TESTCASE( strcmp( s, presort ) == 0 );
#if defined( REGTEST ) && ( defined( __BSD_VISIBLE ) || defined( __APPLE__ ) )
    puts( "qsort.c: Skipping test #4 for BSD as it goes into endless loop here." );
#elif defined( REGTEST ) && defined( __ANDROID__ )
    puts( "qsort.c: Skipping test #4 for Android as it crashes." );
#else
    qsort( s, 100, 0, compare );
    TESTCASE( strcmp( s, presort ) == 0 );
#endif
    return TEST_RESULTS;
}